

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scanner.c
# Opt level: O3

int yaml_parser_fetch_value(yaml_parser_t *parser)

{
  yaml_token_t **ppyVar1;
  size_t *psVar2;
  yaml_mark_t *pyVar3;
  undefined8 *puVar4;
  byte bVar5;
  yaml_simple_key_t *pyVar6;
  size_t sVar7;
  yaml_token_t *pyVar8;
  byte *pbVar9;
  size_t sVar10;
  size_t sVar11;
  size_t sVar12;
  size_t sVar13;
  size_t sVar14;
  int iVar15;
  uint uVar16;
  yaml_token_t *pyVar17;
  long lVar18;
  yaml_mark_t start_mark;
  undefined4 uStack_58;
  undefined4 uStack_54;
  undefined4 uStack_50;
  undefined4 local_4c;
  undefined4 uStack_48;
  
  pyVar6 = (parser->simple_keys).top;
  if (pyVar6[-1].possible == 0) {
    uVar16 = 0;
    if (parser->flow_level == 0) {
      pyVar3 = &parser->mark;
      if (parser->simple_key_allowed == 0) {
        parser->error = YAML_SCANNER_ERROR;
        parser->context = (char *)0x0;
        sVar7 = (parser->mark).line;
        (parser->context_mark).index = pyVar3->index;
        (parser->context_mark).line = sVar7;
        (parser->context_mark).column = (parser->mark).column;
        parser->problem = "mapping values are not allowed in this context";
        sVar7 = (parser->mark).line;
        (parser->problem_mark).index = pyVar3->index;
        (parser->problem_mark).line = sVar7;
        (parser->problem_mark).column = (parser->mark).column;
        return 0;
      }
      iVar15 = yaml_parser_roll_indent
                         (parser,(parser->mark).column,-1,YAML_BLOCK_MAPPING_START_TOKEN,*pyVar3);
      if (iVar15 == 0) {
        return 0;
      }
      uVar16 = (uint)(parser->flow_level == 0);
    }
  }
  else {
    sVar7 = pyVar6[-1].mark.column;
    local_4c = (undefined4)sVar7;
    uStack_48 = (undefined4)(sVar7 >> 0x20);
    sVar11 = pyVar6[-1].mark.index;
    sVar7 = pyVar6[-1].mark.line;
    uStack_58 = (undefined4)(sVar11 >> 0x20);
    uStack_54 = (undefined4)sVar7;
    uStack_50 = (undefined4)(sVar7 >> 0x20);
    sVar7 = pyVar6[-1].mark.column;
    sVar12 = pyVar6[-1].mark.index;
    sVar10 = pyVar6[-1].mark.line;
    pyVar17 = (parser->tokens).tail;
    if (pyVar17 == (parser->tokens).end) {
      ppyVar1 = &(parser->tokens).tail;
      iVar15 = yaml_queue_extend(&(parser->tokens).start,&(parser->tokens).head,ppyVar1,
                                 &(parser->tokens).end);
      if (iVar15 == 0) goto LAB_001b1277;
      pyVar17 = *ppyVar1;
    }
    lVar18 = pyVar6[-1].token_number - parser->tokens_parsed;
    pyVar8 = (parser->tokens).head;
    memmove(pyVar8 + lVar18 + 1,pyVar8 + lVar18,
            (((ulong)((long)pyVar17 - (long)pyVar8) >> 4) * -0x3333333333333333 - lVar18) * 0x50);
    pyVar17 = (parser->tokens).head;
    lVar18 = pyVar6[-1].token_number - parser->tokens_parsed;
    pyVar17[lVar18].type = YAML_KEY_TOKEN;
    *(undefined4 *)((long)&pyVar17[lVar18].start_mark.column + 4) = uStack_48;
    puVar4 = (undefined8 *)((long)&pyVar17[lVar18].start_mark.index + 4);
    *puVar4 = CONCAT44(uStack_54,uStack_58);
    puVar4[1] = CONCAT44(local_4c,uStack_50);
    puVar4 = (undefined8 *)((long)&pyVar17[lVar18].data.scalar.length + 4);
    *puVar4 = 0;
    puVar4[1] = sVar11 << 0x20;
    *(undefined8 *)&pyVar17[lVar18].field_0x4 = 0;
    *(undefined8 *)(&pyVar17[lVar18].field_0x4 + 8) = 0;
    pyVar17[lVar18].end_mark.index = sVar12;
    pyVar17[lVar18].end_mark.line = sVar10;
    pyVar17[lVar18].end_mark.column = sVar7;
    ppyVar1 = &(parser->tokens).tail;
    *ppyVar1 = *ppyVar1 + 1;
    iVar15 = yaml_parser_roll_indent
                       (parser,pyVar6[-1].mark.column,pyVar6[-1].token_number,
                        YAML_BLOCK_MAPPING_START_TOKEN,pyVar6[-1].mark);
    if (iVar15 == 0) {
      return 0;
    }
    pyVar6[-1].possible = 0;
    uVar16 = 0;
  }
  parser->simple_key_allowed = uVar16;
  sVar7 = (parser->mark).column;
  sVar11 = (parser->mark).index;
  sVar12 = (parser->mark).line;
  (parser->mark).index = (parser->mark).index + 1;
  psVar2 = &(parser->mark).column;
  *psVar2 = *psVar2 + 1;
  parser->unread = parser->unread - 1;
  pbVar9 = (parser->buffer).pointer;
  bVar5 = *pbVar9;
  lVar18 = 1;
  if ((((char)bVar5 < '\0') && (lVar18 = 2, (bVar5 & 0xe0) != 0xc0)) &&
     (lVar18 = 3, (bVar5 & 0xf0) != 0xe0)) {
    lVar18 = (ulong)((bVar5 & 0xf8) == 0xf0) << 2;
  }
  (parser->buffer).pointer = pbVar9 + lVar18;
  sVar10 = (parser->mark).column;
  sVar13 = (parser->mark).index;
  sVar14 = (parser->mark).line;
  local_4c = (undefined4)sVar7;
  uStack_48 = (undefined4)(sVar7 >> 0x20);
  uStack_58 = (undefined4)(sVar11 >> 0x20);
  uStack_54 = (undefined4)sVar12;
  uStack_50 = (undefined4)(sVar12 >> 0x20);
  ppyVar1 = &(parser->tokens).tail;
  pyVar17 = (parser->tokens).tail;
  if (pyVar17 == (parser->tokens).end) {
    iVar15 = yaml_queue_extend(&(parser->tokens).start,&(parser->tokens).head,ppyVar1,
                               &(parser->tokens).end);
    if (iVar15 == 0) {
LAB_001b1277:
      parser->error = YAML_MEMORY_ERROR;
      return 0;
    }
    pyVar17 = *ppyVar1;
  }
  *ppyVar1 = pyVar17 + 1;
  pyVar17->type = YAML_VALUE_TOKEN;
  *(undefined8 *)&pyVar17->field_0x4 = 0;
  *(undefined8 *)((long)&(pyVar17->data).alias.value + 4) = 0;
  *(undefined8 *)((long)&(pyVar17->data).tag.suffix + 4) = 0;
  *(size_t *)((long)&pyVar17->data + 0x14) = sVar11 << 0x20;
  *(ulong *)((long)&(pyVar17->start_mark).index + 4) = CONCAT44(uStack_54,uStack_58);
  *(ulong *)((long)&(pyVar17->start_mark).line + 4) = CONCAT44(local_4c,uStack_50);
  *(undefined4 *)((long)&(pyVar17->start_mark).column + 4) = uStack_48;
  (pyVar17->end_mark).index = sVar13;
  (pyVar17->end_mark).line = sVar14;
  (pyVar17->end_mark).column = sVar10;
  return 1;
}

Assistant:

static int
yaml_parser_fetch_value(yaml_parser_t *parser)
{
    yaml_mark_t start_mark, end_mark;
    yaml_token_t token;
    yaml_simple_key_t *simple_key = parser->simple_keys.top-1;

    /* Have we found a simple key? */

    if (simple_key->possible)
    {

        /* Create the KEY token and insert it into the queue. */

        TOKEN_INIT(token, YAML_KEY_TOKEN, simple_key->mark, simple_key->mark);

        if (!QUEUE_INSERT(parser, parser->tokens,
                    simple_key->token_number - parser->tokens_parsed, token))
            return 0;

        /* In the block context, we may need to add the BLOCK-MAPPING-START token. */

        if (!yaml_parser_roll_indent(parser, simple_key->mark.column,
                    simple_key->token_number,
                    YAML_BLOCK_MAPPING_START_TOKEN, simple_key->mark))
            return 0;

        /* Remove the simple key. */

        simple_key->possible = 0;

        /* A simple key cannot follow another simple key. */

        parser->simple_key_allowed = 0;
    }
    else
    {
        /* The ':' indicator follows a complex key. */

        /* In the block context, extra checks are required. */

        if (!parser->flow_level)
        {
            /* Check if we are allowed to start a complex value. */

            if (!parser->simple_key_allowed) {
                return yaml_parser_set_scanner_error(parser, NULL, parser->mark,
                        "mapping values are not allowed in this context");
            }

            /* Add the BLOCK-MAPPING-START token if needed. */

            if (!yaml_parser_roll_indent(parser, parser->mark.column, -1,
                        YAML_BLOCK_MAPPING_START_TOKEN, parser->mark))
                return 0;
        }

        /* Simple keys after ':' are allowed in the block context. */

        parser->simple_key_allowed = (!parser->flow_level);
    }

    /* Consume the token. */

    start_mark = parser->mark;
    SKIP(parser);
    end_mark = parser->mark;

    /* Create the VALUE token and append it to the queue. */

    TOKEN_INIT(token, YAML_VALUE_TOKEN, start_mark, end_mark);

    if (!ENQUEUE(parser, parser->tokens, token))
        return 0;

    return 1;
}